

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O0

nodeid_t __thiscall EthUdpPort::InitNodes(EthUdpPort *this)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  unsigned_long fpga_ver;
  unsigned_long fver;
  EthUdpPort *pEStack_18;
  quadlet_t data;
  EthUdpPort *this_local;
  
  pEStack_18 = this;
  uVar2 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[5])
                    (this,0x3f,0xb,(ulong)(this->sockPtr->ServerAddr).sin_addr.s_addr,0x80);
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                             "InitNodes: failed to write IP address");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._6_2_ = 0;
  }
  else {
    Amp1394_Sleep(0.2);
    fver._4_4_ = 0;
    uVar2 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[4])
                      (this,0x3f,4,(long)&fver + 4,0xc0);
    if ((uVar2 & 1) == 0) {
      poVar3 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                               "InitNodes: failed to read hardware version for hub/bridge board");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      this_local._6_2_ = 0;
    }
    else {
      bVar1 = BasePort::HardwareVersionValid((ulong)fver._4_4_);
      if (bVar1) {
        (this->super_EthBasePort).super_BasePort.FwBusGeneration =
             (this->super_EthBasePort).super_BasePort.newFwBusGeneration;
        poVar3 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                                 "InitNodes: Firewire bus generation = ");
        pvVar4 = (void *)std::ostream::operator<<
                                   (poVar3,(this->super_EthBasePort).super_BasePort.FwBusGeneration)
        ;
        std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
        fver._4_4_ = 0;
        uVar2 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[5])(this,0x3f,1,0,0x80);
        if ((uVar2 & 1) == 0) {
          poVar3 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                                   "InitNodes: failed to broadcast PHY command");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          this_local._6_2_ = 0;
        }
        else {
          Amp1394_Sleep(0.01);
          uVar2 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[4])
                            (this,0x3f,0,(long)&fver + 4,0xc0);
          if ((uVar2 & 1) == 0) {
            poVar3 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                                     "InitNodes: failed to read board id for hub/bridge board");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            this_local._6_2_ = 0;
          }
          else {
            (this->super_EthBasePort).super_BasePort.HubBoard = (byte)(fver._4_4_ >> 0x18) & 0xf;
            poVar3 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                                     "InitNodes: found hub board: ");
            pvVar4 = (void *)std::ostream::operator<<
                                       (poVar3,(uint)(this->super_EthBasePort).super_BasePort.
                                                     HubBoard);
            std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
            uVar2 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[4])
                              (this,0x3f,7,(long)&fver + 4,0xc0);
            if ((uVar2 & 1) == 0) {
              poVar3 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                                       "InitNodes: unable to read firmware version from hub/bridge board"
                                      );
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              this_local._6_2_ = 0;
            }
            else {
              uVar5 = (ulong)fver._4_4_;
              (this->super_EthBasePort).super_BasePort.FirmwareVersion
              [(this->super_EthBasePort).super_BasePort.HubBoard] = (ulong)fver._4_4_;
              uVar2 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[4])
                                (this,0x3f,0xc,(long)&fver + 4,0xc0);
              if ((uVar2 & 1) == 0) {
                poVar3 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                                         "InitNodes: failed to read Ethernet status from hub/bridge board"
                                        );
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                this_local._6_2_ = 0;
              }
              else {
                uVar2 = BoardIO::GetFpgaVersionMajorFromStatus(fver._4_4_);
                uVar6 = (ulong)uVar2;
                (this->super_EthBasePort).super_BasePort.FpgaVersion
                [(this->super_EthBasePort).super_BasePort.HubBoard] = uVar2;
                if ((((this->super_EthBasePort).useFwBridge & 1U) == 0) &&
                   ((uVar6 != 3 || (uVar5 < 9)))) {
                  if (uVar6 == 3) {
                    if (uVar5 < 9) {
                      poVar3 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                                               "InitNodes: hub board has Firmware Rev ");
                      std::ostream::operator<<(poVar3,uVar5);
                    }
                  }
                  else {
                    poVar3 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                                             "InitNodes: hub board is FPGA V");
                    std::ostream::operator<<(poVar3,uVar6);
                  }
                  poVar3 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                                           ", using Ethernet/Firewire bridge");
                  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                  (this->super_EthBasePort).useFwBridge = true;
                }
                else if (((this->super_EthBasePort).useFwBridge & 1U) == 0) {
                  poVar3 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                                           "InitNodes: using Ethernet network");
                  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                }
                else {
                  poVar3 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                                           "InitNodes: using Ethernet/Firewire bridge");
                  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                }
                this_local._6_2_ = 0x10;
              }
            }
          }
        }
      }
      else {
        poVar3 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                                 "InitNodes: hub board is not a supported board, data = ");
        pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
        pvVar4 = (void *)std::ostream::operator<<(pvVar4,fver._4_4_);
        std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
        this_local._6_2_ = 0;
      }
    }
  }
  return this_local._6_2_;
}

Assistant:

nodeid_t EthUdpPort::InitNodes(void)
{
    // First, set IP address by Ethernet and FireWire broadcast
    // For Firmware Rev 9+, this also causes the FPGA to send a raw Ethernet multicast quadlet write packet
    // so that the port forwarding database in the FPGA V3 Ethernet Switch gets updated
    if (!WriteQuadletNode(FW_NODE_BROADCAST, BoardIO::IP_ADDR, sockPtr->ServerAddr.sin_addr.s_addr, FW_NODE_ETH_BROADCAST_MASK)) {
        outStr << "InitNodes: failed to write IP address" << std::endl;
        return 0;
    }
    Amp1394_Sleep(0.2);

    quadlet_t data = 0;

    // Check hardware version of hub board
    if (!ReadQuadletNode(FW_NODE_BROADCAST, BoardIO::HARDWARE_VERSION, data,
                         FW_NODE_NOFORWARD_MASK | FW_NODE_ETH_BROADCAST_MASK)) {
        outStr << "InitNodes: failed to read hardware version for hub/bridge board" << std::endl;
        return 0;
    }
    if (!HardwareVersionValid(data)) {
        outStr << "InitNodes: hub board is not a supported board, data = " << std::hex << data << std::endl;
        return 0;
    }

    // ReadQuadletNode should have updated bus generation
    FwBusGeneration = newFwBusGeneration;
    outStr << "InitNodes: Firewire bus generation = " << FwBusGeneration << std::endl;

    // Broadcast a command to initiate a read of Firewire PHY Register 0. In cases where there is no
    // Firewire bus master (i.e., only FPGA/QLA boards on the Firewire bus), this allows each board
    // to obtain its Firewire node id.
    data = 0;
    if (!WriteQuadletNode(FW_NODE_BROADCAST, BoardIO::FW_PHY_REQ, data, FW_NODE_ETH_BROADCAST_MASK)) {
        outStr << "InitNodes: failed to broadcast PHY command" << std::endl;
        return 0;
    }
    Amp1394_Sleep(0.01);

    // Find board id for first board (i.e., one connected by Ethernet) by FireWire and Ethernet broadcast
    if (!ReadQuadletNode(FW_NODE_BROADCAST, BoardIO::BOARD_STATUS, data,
                         FW_NODE_NOFORWARD_MASK | FW_NODE_ETH_BROADCAST_MASK)) {
        outStr << "InitNodes: failed to read board id for hub/bridge board" << std::endl;
        return 0;
    }
    // board_id is bits 27-24, BOARD_ID_MASK = 0x0f000000
    HubBoard = (data & BOARD_ID_MASK) >> 24;
    outStr << "InitNodes: found hub board: " << static_cast<int>(HubBoard) << std::endl;

    // read firmware version
    if (!ReadQuadletNode(FW_NODE_BROADCAST, BoardIO::FIRMWARE_VERSION, data,
                         FW_NODE_NOFORWARD_MASK | FW_NODE_ETH_BROADCAST_MASK)) {
        outStr << "InitNodes: unable to read firmware version from hub/bridge board" << std::endl;
        return 0;
    }
    unsigned long fver = data;
    FirmwareVersion[HubBoard] = data;

    // Get FPGA version of Hub board
    if (!ReadQuadletNode(FW_NODE_BROADCAST, BoardIO::ETH_STATUS, data,
                         FW_NODE_NOFORWARD_MASK | FW_NODE_ETH_BROADCAST_MASK)) {
        outStr << "InitNodes: failed to read Ethernet status from hub/bridge board" << std::endl;
        return 0;
    }
    unsigned long fpga_ver = BoardIO::GetFpgaVersionMajorFromStatus(data);
    FpgaVersion[HubBoard] = fpga_ver;

    if (!useFwBridge && ((fpga_ver != 3) || (fver < 9))) {
        if (fpga_ver != 3)
            outStr << "InitNodes: hub board is FPGA V" << fpga_ver;
        else if (fver < 9)
            outStr << "InitNodes: hub board has Firmware Rev " << fver;
        outStr << ", using Ethernet/Firewire bridge" << std::endl;
        useFwBridge = true;
    }
    else if (useFwBridge)
        outStr << "InitNodes: using Ethernet/Firewire bridge" << std::endl;
    else
        outStr << "InitNodes: using Ethernet network" << std::endl;

    // Scan for up to 16 nodes on bus
    return BoardIO::MAX_BOARDS;
}